

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::MergeGenericAddendSub
               (uint32_t addend,uint32_t sub,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  IRContext *this;
  uint32_t uVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  Operand *local_e0;
  allocator<spvtools::opt::Operand> local_cd;
  uint32_t local_cc;
  iterator local_c8;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  Instruction *sub_inst;
  DefUseManager *def_use_mgr;
  IRContext *context;
  Instruction *inst_local;
  uint32_t local_10;
  uint32_t sub_local;
  uint32_t addend_local;
  
  context = (IRContext *)inst;
  inst_local._4_4_ = sub;
  local_10 = addend;
  def_use_mgr = (DefUseManager *)Instruction::context(inst);
  sub_inst = (Instruction *)IRContext::get_def_use_mgr((IRContext *)def_use_mgr);
  local_38._M_head_impl =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       analysis::DefUseManager::GetDef((DefUseManager *)sub_inst,inst_local._4_4_);
  OVar3 = Instruction::opcode((Instruction *)local_38._M_head_impl);
  if ((OVar3 != OpFSub) &&
     (OVar3 = Instruction::opcode((Instruction *)local_38._M_head_impl), OVar3 != OpISub)) {
    return false;
  }
  OVar3 = Instruction::opcode((Instruction *)local_38._M_head_impl);
  if ((OVar3 == OpFSub) &&
     (bVar2 = Instruction::IsFloatingPointFoldingAllowed((Instruction *)local_38._M_head_impl),
     !bVar2)) {
    return false;
  }
  uVar1 = local_10;
  uVar4 = Instruction::GetSingleWordInOperand((Instruction *)local_38._M_head_impl,1);
  if (uVar1 == uVar4) {
    Instruction::SetOpcode((Instruction *)context,OpCopyObject);
    this = context;
    local_cc = Instruction::GetSingleWordInOperand((Instruction *)local_38._M_head_impl,0);
    local_c8 = &local_cc;
    local_c0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_c8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
    Operand::Operand(&local_90,SPV_OPERAND_TYPE_ID,&local_b8);
    local_60 = &local_90;
    local_58 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator(&local_cd);
    __l._M_len = (size_type)local_58;
    __l._M_array = local_60;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_50,__l,&local_cd);
    Instruction::SetInOperands((Instruction *)this,&local_50);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_cd);
    local_e0 = (Operand *)&local_60;
    do {
      local_e0 = local_e0 + -1;
      Operand::~Operand(local_e0);
    } while (local_e0 != &local_90);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
    IRContext::UpdateDefUse((IRContext *)def_use_mgr,(Instruction *)context);
    sub_local._3_1_ = true;
  }
  else {
    sub_local._3_1_ = false;
  }
  return sub_local._3_1_;
}

Assistant:

bool MergeGenericAddendSub(uint32_t addend, uint32_t sub, Instruction* inst) {
  IRContext* context = inst->context();
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  Instruction* sub_inst = def_use_mgr->GetDef(sub);
  if (sub_inst->opcode() != spv::Op::OpFSub &&
      sub_inst->opcode() != spv::Op::OpISub)
    return false;
  if (sub_inst->opcode() == spv::Op::OpFSub &&
      !sub_inst->IsFloatingPointFoldingAllowed())
    return false;
  if (addend != sub_inst->GetSingleWordInOperand(1)) return false;
  inst->SetOpcode(spv::Op::OpCopyObject);
  inst->SetInOperands(
      {{SPV_OPERAND_TYPE_ID, {sub_inst->GetSingleWordInOperand(0)}}});
  context->UpdateDefUse(inst);
  return true;
}